

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageSizeTests.cpp
# Opt level: O0

VkDescriptorSetLayout __thiscall
vkt::image::anon_unknown_0::BufferSizeTestInstance::prepareDescriptors(BufferSizeTestInstance *this)

{
  VkDescriptorPool descriptorPool;
  RefData<vk::Handle<(vk::HandleType)19>_> data;
  RefData<vk::Handle<(vk::HandleType)21>_> data_00;
  RefData<vk::Handle<(vk::HandleType)22>_> data_01;
  VkDevice device_00;
  VkDevice vk_00;
  DescriptorSetLayoutBuilder *pDVar1;
  DescriptorPoolBuilder *pDVar2;
  Handle<(vk::HandleType)21> *pHVar3;
  Handle<(vk::HandleType)19> *pHVar4;
  Buffer *this_00;
  VkBuffer *pVVar5;
  Handle<(vk::HandleType)22> *pHVar6;
  Handle<(vk::HandleType)12> *pTexelBufferView;
  DescriptorSetUpdateBuilder *pDVar7;
  Location local_1f0;
  VkDescriptorSet local_1e8;
  Location local_1e0;
  VkDescriptorSet local_1d8;
  DescriptorSetUpdateBuilder local_1d0;
  deUint64 local_188;
  undefined1 local_180 [8];
  VkDescriptorBufferInfo descriptorBufferInfo;
  Move<vk::Handle<(vk::HandleType)22>_> local_158;
  RefData<vk::Handle<(vk::HandleType)22>_> local_138;
  DescriptorPoolBuilder local_118;
  Move<vk::Handle<(vk::HandleType)21>_> local_100;
  RefData<vk::Handle<(vk::HandleType)21>_> local_e0;
  DescriptorSetLayoutBuilder local_b0;
  Move<vk::Handle<(vk::HandleType)19>_> local_68;
  RefData<vk::Handle<(vk::HandleType)19>_> local_48;
  VkDevice local_28;
  VkDevice device;
  DeviceInterface *vk;
  BufferSizeTestInstance *this_local;
  
  vk = (DeviceInterface *)this;
  device = (VkDevice)
           Context::getDeviceInterface((this->super_SizeTestInstance).super_TestInstance.m_context);
  local_28 = Context::getDevice((this->super_SizeTestInstance).super_TestInstance.m_context);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_b0);
  pDVar1 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (&local_b0,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,0x20);
  pDVar1 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                     (pDVar1,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,0x20);
  ::vk::DescriptorSetLayoutBuilder::build(&local_68,pDVar1,(DeviceInterface *)device,local_28,0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_48,(Move *)&local_68);
  data.deleter.m_deviceIface = local_48.deleter.m_deviceIface;
  data.object.m_internal = local_48.object.m_internal;
  data.deleter.m_device = local_48.deleter.m_device;
  data.deleter.m_allocator = local_48.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::operator=
            (&this->m_descriptorSetLayout,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::~Move(&local_68);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_b0);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder(&local_118);
  pDVar2 = ::vk::DescriptorPoolBuilder::addType
                     (&local_118,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,1);
  pDVar2 = ::vk::DescriptorPoolBuilder::addType(pDVar2,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,1);
  ::vk::DescriptorPoolBuilder::build(&local_100,pDVar2,(DeviceInterface *)device,local_28,1,1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_e0,(Move *)&local_100);
  data_00.deleter.m_deviceIface = local_e0.deleter.m_deviceIface;
  data_00.object.m_internal = local_e0.object.m_internal;
  data_00.deleter.m_device = local_e0.deleter.m_device;
  data_00.deleter.m_allocator = local_e0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::operator=
            (&this->m_descriptorPool,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::~Move(&local_100);
  ::vk::DescriptorPoolBuilder::~DescriptorPoolBuilder(&local_118);
  vk_00 = device;
  device_00 = local_28;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::operator*
                     (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  descriptorPool.m_internal = pHVar3->m_internal;
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  descriptorBufferInfo.range = pHVar4->m_internal;
  makeDescriptorSet(&local_158,(DeviceInterface *)vk_00,device_00,descriptorPool,
                    (VkDescriptorSetLayout)descriptorBufferInfo.range);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_138,(Move *)&local_158);
  data_01.deleter.m_deviceIface = local_138.deleter.m_deviceIface;
  data_01.object.m_internal = local_138.object.m_internal;
  data_01.deleter.m_device = local_138.deleter.m_device;
  data_01.deleter.m_pool.m_internal = local_138.deleter.m_pool.m_internal;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::operator=(&this->m_descriptorSet,data_01)
  ;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::~Move(&local_158);
  this_00 = de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::
            operator->(&(this->super_SizeTestInstance).m_resultBuffer.
                        super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>
                      );
  pVVar5 = image::Buffer::get(this_00);
  local_188 = pVVar5->m_internal;
  ::vk::makeDescriptorBufferInfo
            ((VkDescriptorBufferInfo *)local_180,(VkBuffer)local_188,0,
             (this->super_SizeTestInstance).m_resultBufferSizeBytes);
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder(&local_1d0);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_1d8.m_internal = pHVar6->m_internal;
  local_1e0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(0);
  pTexelBufferView =
       ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)12>_>::get
                 (&(this->m_bufferView).super_RefBase<vk::Handle<(vk::HandleType)12>_>);
  pDVar7 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (&local_1d0,local_1d8,&local_1e0,VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER,
                      pTexelBufferView);
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::operator*
                     (&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  local_1e8.m_internal = pHVar6->m_internal;
  local_1f0 = ::vk::DescriptorSetUpdateBuilder::Location::binding(1);
  pDVar7 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                     (pDVar7,local_1e8,&local_1f0,VK_DESCRIPTOR_TYPE_STORAGE_BUFFER,
                      (VkDescriptorBufferInfo *)local_180);
  ::vk::DescriptorSetUpdateBuilder::update(pDVar7,(DeviceInterface *)device,local_28);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder(&local_1d0);
  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::operator*
                     (&(this->m_descriptorSetLayout).super_RefBase<vk::Handle<(vk::HandleType)19>_>)
  ;
  return (VkDescriptorSetLayout)pHVar4->m_internal;
}

Assistant:

VkDescriptorSetLayout BufferSizeTestInstance::prepareDescriptors (void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	m_descriptorSetLayout = DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(vk, device);

	m_descriptorPool = DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER)
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_BUFFER)
		.build(vk, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	m_descriptorSet = makeDescriptorSet(vk, device, *m_descriptorPool, *m_descriptorSetLayout);

	const VkDescriptorBufferInfo descriptorBufferInfo = makeDescriptorBufferInfo(m_resultBuffer->get(), 0ull, m_resultBufferSizeBytes);

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_TEXEL_BUFFER, &m_bufferView.get())
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(1u), VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, &descriptorBufferInfo)
		.update(vk, device);

	return *m_descriptorSetLayout;
}